

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType __thiscall ValueType::Merge(ValueType *this,Var var)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  Bits BVar4;
  undefined4 *puVar5;
  RecyclableObject *recyclableObject;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_84;
  Var var_local;
  ValueType *this_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_64;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5e;
  ValueType merged_2;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  ValueType merged_1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType merged;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x44d,"(var)","var");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Js::TaggedInt::Is(var);
  if (bVar2) {
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)GetTaggedInt();
    merged = Verify(*(ValueType *)&(this->field_0).field_0);
    local_1e.field_0 = aVar3.field_0;
    local_20.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         Verify((ValueType)aVar3);
    local_22.field_0 = aVar3.field_0;
    bVar2 = operator==(this,(ValueType)aVar3.field_0);
    if (bVar2) {
      local_a.field_0 = (this->field_0).field_0;
    }
    else {
      BVar4 = operator|((this->field_0).bits,aVar3.bits);
      ValueType((ValueType *)&local_24.field_0,BVar4);
      bVar2 = OneOn((ValueType *)&local_24.field_0,Object);
      if (bVar2) {
        local_a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             MergeWithObject(this,(ValueType)aVar3.field_0);
      }
      else {
        local_a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             Verify(local_24.field_0);
      }
    }
    this_local._6_2_ = local_a.field_0;
  }
  else {
    bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(var);
    if (bVar2) {
      bVar2 = IsUninitialized(this);
      if (((bVar2) || (bVar2 = IsLikelyInt(this), bVar2)) &&
         (bVar2 = Js::JavascriptNumber::IsInt32_NoChecks(var), bVar2)) {
        local_84.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)GetInt(false);
      }
      else {
        local_84 = Float.field_0;
      }
      merged_1 = Verify(*(ValueType *)&(this->field_0).field_0);
      local_3e.field_0 = local_84.field_0;
      local_40.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           Verify(local_84.field_0);
      local_42.field_0 = local_84.field_0;
      bVar2 = operator==(this,(ValueType)local_84.field_0);
      if (bVar2) {
        local_2a.field_0 = (this->field_0).field_0;
      }
      else {
        BVar4 = operator|((this->field_0).bits,local_84.bits);
        ValueType((ValueType *)&local_44.field_0,BVar4);
        bVar2 = OneOn((ValueType *)&local_44.field_0,Object);
        if (bVar2) {
          local_2a.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               MergeWithObject(this,local_84.field_0);
        }
        else {
          local_2a.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               Verify(local_44.field_0);
        }
      }
      this_local._6_2_ = local_2a.field_0;
    }
    else {
      recyclableObject = Js::UnsafeVarTo<Js::RecyclableObject>(var);
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           FromObject(recyclableObject);
      merged_2 = Verify(*(ValueType *)&(this->field_0).field_0);
      local_5e.field_0 = aVar3.field_0;
      local_60.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           Verify((ValueType)aVar3);
      local_62.field_0 = aVar3.field_0;
      bVar2 = operator==(this,(ValueType)aVar3.field_0);
      if (bVar2) {
        local_4a.field_0 = (this->field_0).field_0;
      }
      else {
        BVar4 = operator|((this->field_0).bits,aVar3.bits);
        ValueType((ValueType *)&local_64.field_0,BVar4);
        bVar2 = OneOn((ValueType *)&local_64.field_0,Object);
        if (bVar2) {
          local_4a.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               MergeWithObject(this,(ValueType)aVar3.field_0);
        }
        else {
          local_4a.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               Verify(local_64.field_0);
        }
      }
      this_local._6_2_ = local_4a.field_0;
    }
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)this_local._6_2_;
}

Assistant:

ValueType ValueType::Merge(const Js::Var var) const
{
    using namespace Js;
    Assert(var);

    if(TaggedInt::Is(var))
        return Merge(GetTaggedInt());
    if(JavascriptNumber::Is_NoTaggedIntCheck(var))
    {
        return
            Merge(
                (IsUninitialized() || IsLikelyInt()) && JavascriptNumber::IsInt32_NoChecks(var)
                    ? GetInt(false)
                    : ValueType::Float);
    }
    return Merge(FromObject(UnsafeVarTo<RecyclableObject>(var)));
}